

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

char * netaddr_to_prefixstring(netaddr_str *dst,netaddr *src,_Bool forceprefix)

{
  byte bVar1;
  ulong uVar2;
  char separator;
  int __af;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  netaddr_str *__s;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  netaddr *bin;
  
  if (src == (netaddr *)0x0) {
LAB_001439f8:
    pcVar5 = strscpy(dst->buf,"-",0x3e);
    return pcVar5;
  }
  bVar1 = src->_type;
  bVar3 = netaddr_get_af_maxprefix((uint)bVar1);
  if (bVar1 == 2) {
    __af = 2;
  }
  else {
    if (bVar1 != 10) {
      if (bVar1 == 0x2f) {
        sVar8 = 6;
        separator = ':';
      }
      else {
        if (bVar1 != 0x30) {
          if (bVar1 != 0x31) goto LAB_001439f8;
          sVar8 = 0x3e;
          lVar7 = 0;
          pcVar5 = dst->buf;
          bin = src;
          for (; __s = dst, lVar7 != 0x28; lVar7 = lVar7 + 8) {
            uVar2 = *(ulong *)((long)&_uuid_from_string_max_group_len + lVar7);
            pcVar4 = _mac_to_string(pcVar5,sVar8,bin,uVar2 >> 1,'\0');
            if (pcVar4 == (char *)0x0) {
              __s = (netaddr_str *)0x0;
              break;
            }
            pcVar5 = (char *)((long)((netaddr_str *)pcVar5)->buf + uVar2);
            sVar8 = sVar8 - uVar2;
            if (lVar7 != 0x20) {
              ((netaddr_str *)pcVar5)->buf[0] = '-';
              pcVar5 = (char *)((long)((netaddr_str *)pcVar5)->buf + 1);
              sVar8 = sVar8 - 1;
            }
            bin = (netaddr *)(bin->_addr + (uVar2 >> 1));
          }
          goto LAB_00143a51;
        }
        sVar8 = 8;
        separator = '-';
      }
      __s = (netaddr_str *)_mac_to_string(dst->buf,0x3e,src,sVar8,separator);
      goto LAB_00143a51;
    }
    __af = 10;
  }
  __s = (netaddr_str *)inet_ntop(__af,src,dst->buf,0x3e);
LAB_00143a51:
  bVar1 = src->_prefix_len;
  if ((forceprefix) || (bVar1 < bVar3)) {
    sVar6 = strlen(__s->buf);
    snprintf(dst->buf + sVar6,5,"/%d",(ulong)bVar1);
  }
  return __s->buf;
}

Assistant:

const char *
netaddr_to_prefixstring(struct netaddr_str *dst, const struct netaddr *src, bool forceprefix) {
  static const char *NONE = "-";
  const char *result = NULL;
  int maxprefix;

  if (!src) {
    return strscpy(dst->buf, NONE, sizeof(*dst));
  }

  maxprefix = netaddr_get_maxprefix(src);
  switch (src->_type) {
    case AF_INET:
      result = inet_ntop(AF_INET, src->_addr, dst->buf, sizeof(*dst));
      break;
    case AF_INET6:
      result = inet_ntop(AF_INET6, src->_addr, dst->buf, sizeof(*dst));
      break;
    case AF_MAC48:
      result = _mac_to_string(dst->buf, sizeof(*dst), src->_addr, 6, ':');
      break;
    case AF_EUI64:
      result = _mac_to_string(dst->buf, sizeof(*dst), src->_addr, 8, '-');
      break;
    case AF_UUID:
      result = _uuid_to_string(dst->buf, sizeof(*dst), src->_addr, 16);
      break;
    case AF_UNSPEC:
      /* fall through */
    default:
      return strscpy(dst->buf, NONE, sizeof(*dst));
  }
  if (forceprefix || src->_prefix_len < maxprefix) {
    /* append prefix */
    snprintf(dst->buf + strlen(result), 5, "/%d", src->_prefix_len);
  }
  return result;
}